

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzwrite(BZFILE *b,void *buf,int len)

{
  int local_28;
  int local_24;
  int bzerr;
  int len_local;
  void *buf_local;
  BZFILE *b_local;
  
  local_24 = len;
  _bzerr = buf;
  buf_local = b;
  BZ2_bzWrite(&local_28,b,buf,len);
  if (local_28 == 0) {
    b_local._4_4_ = local_24;
  }
  else {
    b_local._4_4_ = -1;
  }
  return b_local._4_4_;
}

Assistant:

int BZ_API(BZ2_bzwrite) (BZFILE* b, void* buf, int len )
{
   int bzerr;

   BZ2_bzWrite(&bzerr,b,buf,len);
   if(bzerr == BZ_OK){
      return len;
   }else{
      return -1;
   }
}